

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::CidrRange> * __thiscall
kj::ArrayBuilder<kj::CidrRange>::operator=
          (ArrayBuilder<kj::CidrRange> *this,ArrayBuilder<kj::CidrRange> *other)

{
  CidrRange *pCVar1;
  RemoveConst<kj::CidrRange> *pRVar2;
  CidrRange *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CidrRange *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->ptr = (CidrRange *)0x0;
    this->pos = (RemoveConst<kj::CidrRange> *)0x0;
    this->endPtr = (CidrRange *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,0x18,((long)pRVar2 - (long)pCVar1 >> 3) * -0x5555555555555555,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x5555555555555555,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (CidrRange *)0x0;
  other->pos = (RemoveConst<kj::CidrRange> *)0x0;
  other->endPtr = (CidrRange *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }